

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte bVar2;
  uchar uVar3;
  uchar *puVar4;
  byte *pbVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  
  puVar4 = data;
  if (req_comp != img_n) {
    puVar4 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar4 == (uchar *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -0x10) = "Out of memory";
      puVar4 = (uchar *)0x0;
    }
    else {
      if (0 < (int)y) {
        iVar7 = req_comp + img_n * 8;
        iVar1 = x - 1;
        uVar13 = 0;
        uVar10 = 0;
        uVar12 = 0;
        do {
          if (iVar7 - 10U < 0x1a) {
            iVar8 = (int)uVar12 * x;
            pbVar5 = data + (uint)(iVar8 * img_n);
            pbVar9 = puVar4 + (uint)(iVar8 * req_comp);
            switch(iVar7) {
            case 10:
              if (-1 < iVar1) {
                lVar6 = 0;
                uVar11 = x;
                do {
                  puVar4[lVar6 * 2 + uVar10] = data[lVar6 + uVar13];
                  puVar4[lVar6 * 2 + uVar10 + 1] = 0xff;
                  uVar11 = uVar11 - 1;
                  lVar6 = lVar6 + 1;
                } while (0 < (int)uVar11);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                pbVar9 = puVar4 + uVar10 + 2;
                uVar11 = x;
                do {
                  bVar2 = *pbVar5;
                  *pbVar9 = bVar2;
                  pbVar9[-1] = bVar2;
                  pbVar9[-2] = bVar2;
                  pbVar5 = pbVar5 + 1;
                  uVar11 = uVar11 - 1;
                  pbVar9 = pbVar9 + 3;
                } while (0 < (int)uVar11);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar6 = 0;
                uVar11 = x;
                do {
                  uVar3 = data[lVar6 + uVar13];
                  puVar4[lVar6 * 4 + uVar10 + 2] = uVar3;
                  puVar4[lVar6 * 4 + uVar10 + 1] = uVar3;
                  puVar4[lVar6 * 4 + uVar10] = uVar3;
                  puVar4[lVar6 * 4 + uVar10 + 3] = 0xff;
                  uVar11 = uVar11 - 1;
                  lVar6 = lVar6 + 1;
                } while (0 < (int)uVar11);
              }
              break;
            case 0x11:
              if (-1 < iVar1) {
                lVar6 = 0;
                uVar11 = x;
                do {
                  puVar4[lVar6 + uVar10] = data[lVar6 * 2 + uVar13];
                  uVar11 = uVar11 - 1;
                  lVar6 = lVar6 + 1;
                } while (0 < (int)uVar11);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                pbVar9 = puVar4 + uVar10 + 2;
                uVar11 = x;
                do {
                  bVar2 = *pbVar5;
                  *pbVar9 = bVar2;
                  pbVar9[-1] = bVar2;
                  pbVar9[-2] = bVar2;
                  pbVar5 = pbVar5 + 2;
                  uVar11 = uVar11 - 1;
                  pbVar9 = pbVar9 + 3;
                } while (0 < (int)uVar11);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar6 = 0;
                uVar11 = x;
                do {
                  uVar3 = data[lVar6 + uVar13];
                  puVar4[lVar6 * 2 + uVar10 + 2] = uVar3;
                  puVar4[lVar6 * 2 + uVar10 + 1] = uVar3;
                  puVar4[lVar6 * 2 + uVar10] = uVar3;
                  puVar4[lVar6 * 2 + uVar10 + 3] = data[lVar6 + uVar13 + 1];
                  uVar11 = uVar11 - 1;
                  lVar6 = lVar6 + 2;
                } while (0 < (int)uVar11);
              }
              break;
            case 0x19:
              uVar11 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar5[2];
                  *pbVar9 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                   (uint)pbVar5[1] * 0x96 + (uint)*pbVar5 * 0x4d >> 8);
                  pbVar5 = pbVar5 + 3;
                  pbVar9 = pbVar9 + 1;
                  uVar11 = uVar11 - 1;
                } while (0 < (int)uVar11);
              }
              break;
            case 0x1a:
              uVar11 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar5[2];
                  *pbVar9 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                   (uint)pbVar5[1] * 0x96 + (uint)*pbVar5 * 0x4d >> 8);
                  pbVar9[1] = 0xff;
                  pbVar5 = pbVar5 + 3;
                  pbVar9 = pbVar9 + 2;
                  uVar11 = uVar11 - 1;
                } while (0 < (int)uVar11);
              }
              break;
            case 0x1c:
              uVar11 = x;
              if (-1 < iVar1) {
                do {
                  *pbVar9 = *pbVar5;
                  pbVar9[1] = pbVar5[1];
                  pbVar9[2] = pbVar5[2];
                  pbVar9[3] = 0xff;
                  pbVar5 = pbVar5 + 3;
                  pbVar9 = pbVar9 + 4;
                  uVar11 = uVar11 - 1;
                } while (0 < (int)uVar11);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar6 = 0;
                uVar11 = x;
                do {
                  bVar2 = data[lVar6 * 4 + uVar13 + 2];
                  puVar4[lVar6 + uVar10] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar6 * 4 + uVar13 + 1] * 0x96 +
                               (uint)data[lVar6 * 4 + uVar13] * 0x4d >> 8);
                  uVar11 = uVar11 - 1;
                  lVar6 = lVar6 + 1;
                } while (0 < (int)uVar11);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar6 = 0;
                uVar11 = x;
                do {
                  bVar2 = data[lVar6 * 2 + uVar13 + 2];
                  puVar4[lVar6 + uVar10] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar6 * 2 + uVar13 + 1] * 0x96 +
                               (uint)data[lVar6 * 2 + uVar13] * 0x4d >> 8);
                  puVar4[lVar6 + uVar10 + 1] = data[lVar6 * 2 + uVar13 + 3];
                  uVar11 = uVar11 - 1;
                  lVar6 = lVar6 + 2;
                } while (0 < (int)uVar11);
              }
              break;
            case 0x23:
              uVar11 = x;
              if (-1 < iVar1) {
                do {
                  *pbVar9 = *pbVar5;
                  pbVar9[1] = pbVar5[1];
                  pbVar9[2] = pbVar5[2];
                  pbVar5 = pbVar5 + 4;
                  pbVar9 = pbVar9 + 3;
                  uVar11 = uVar11 - 1;
                } while (0 < (int)uVar11);
              }
            }
          }
          uVar12 = uVar12 + 1;
          uVar10 = (ulong)((int)uVar10 + x * req_comp);
          uVar13 = (ulong)((int)uVar13 + x * img_n);
        } while (uVar12 != y);
      }
      free(data);
    }
  }
  return puVar4;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}